

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::JsonReporter::sectionEnded(JsonReporter *this,SectionStats *param_2)

{
  JsonReporter *in_RSI;
  
  endArray(in_RSI);
  endObject(in_RSI);
  return;
}

Assistant:

void JsonReporter::sectionEnded( SectionStats const& /*sectionStats */) {
        // End the subpath array
        endArray();
        // TODO: metadata
        // TODO: what info do we have here?

        // End the section object
        endObject();
    }